

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O3

void t3(void)

{
  int got;
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  
  puts("PWM/Servo pulse accuracy tests.");
  iVar2 = 2;
  callback(0x19,2,t3cbf);
  lVar3 = 0;
  do {
    iVar1 = *(int *)((long)&DAT_00106b00 + lVar3);
    set_servo_pulsewidth(0x19,iVar1);
    got = get_servo_pulsewidth(0x19);
    CHECK(3,iVar2 + -1,got,iVar1,0,"get servo pulsewidth");
    time_sleep(0x3ff0000000000000);
    t3_reset = 1;
    time_sleep(0x4010000000000000);
    CHECK(3,iVar2,(int)(((t3_off + t3_on) * 1000.0) / t3_on),(int)(20000000.0 / (double)iVar1),1,
          "set servo pulsewidth");
    lVar3 = lVar3 + 4;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0xc);
  lVar3 = 0;
  set_servo_pulsewidth(0x19,0);
  set_PWM_frequency(0x19,1000);
  iVar2 = get_PWM_frequency(0x19);
  CHECK(3,7,iVar2,1000,0,"set/get PWM frequency");
  iVar2 = set_PWM_range(0x19,100);
  CHECK(3,8,iVar2,200,0,"set PWM range");
  piVar4 = &DAT_00106b50;
  do {
    iVar2 = *piVar4;
    set_PWM_dutycycle(0x19,iVar2);
    iVar1 = get_PWM_dutycycle(0x19);
    CHECK(3,(uint)lVar3 | 9,iVar1,iVar2,0,"get PWM dutycycle");
    time_sleep(0x3ff0000000000000);
    t3_reset = 1;
    time_sleep(0x4000000000000000);
    CHECK(3,(uint)lVar3 + 10,(int)((t3_on * 1000.0) / (t3_on + t3_off)),iVar2 * 10,1,
          "set PWM dutycycle");
    piVar4 = piVar4 + 1;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 8);
  set_PWM_dutycycle(0x19,0);
  return;
}

Assistant:

void t3()
{
   int pw[3]={500, 1500, 2500};
   int dc[4]={20, 40, 60, 80};

   int f, rr, v;
   float on, off;

   int t;

   printf("PWM/Servo pulse accuracy tests.\n");

   callback(GPIO, EITHER_EDGE, t3cbf);

   for (t=0; t<3; t++)
   {
      set_servo_pulsewidth(GPIO, pw[t]);
      v = get_servo_pulsewidth(GPIO);
      CHECK(3, t+t+1, v, pw[t], 0, "get servo pulsewidth");

      time_sleep(1);
      t3_reset = 1;
      time_sleep(4);
      on = t3_on;
      off = t3_off;
      CHECK(3, t+t+2, (1000.0*(on+off))/on, 20000000.0/pw[t], 1,
         "set servo pulsewidth");
   }

   set_servo_pulsewidth(GPIO, 0);
   set_PWM_frequency(GPIO, 1000);
   f = get_PWM_frequency(GPIO);
   CHECK(3, 7, f, 1000, 0, "set/get PWM frequency");

   rr = set_PWM_range(GPIO, 100);
   CHECK(3, 8, rr, 200, 0, "set PWM range");

   for (t=0; t<4; t++)
   {
      set_PWM_dutycycle(GPIO, dc[t]);
      v = get_PWM_dutycycle(GPIO);
      CHECK(3, t+t+9, v, dc[t], 0, "get PWM dutycycle");

      time_sleep(1);
      t3_reset = 1;
      time_sleep(2);
      on = t3_on;
      off = t3_off;
      CHECK(3, t+t+10, (1000.0*on)/(on+off), 10.0*dc[t], 1,
         "set PWM dutycycle");
   }

   set_PWM_dutycycle(GPIO, 0);

}